

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O3

uint my_rational_to_uint(my_rational *a,uint scale,uint *remainder)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  _Bool _Var4;
  wchar_t wVar5;
  size_t sVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint16_t qr_u16n [2];
  uint16_t d_u16n [2];
  uint16_t rr_u16n [4];
  uint16_t p_u16n [4];
  uint16_t r2_u16n [2];
  uint16_t r_u16n [2];
  uint16_t w_u16n [3];
  
  if (scale == 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = a->d;
    uVar1 = (ulong)a->n / (ulong)uVar11;
    uVar2 = (ulong)a->n % (ulong)uVar11;
    if ((int)(scale * uVar1 >> 0x20) == 0) {
      uVar3 = (ulong)scale % (ulong)uVar11;
      uVar10 = (int)uVar1 * scale;
      uVar9 = (uint)uVar2;
      uVar7 = (scale / uVar11) * uVar9;
      uVar8 = uVar7 + uVar10;
      if (!CARRY4(uVar7,uVar10)) {
        if ((uVar9 == 0) || ((int)(uVar2 * uVar3 >> 0x20) == 0)) {
          uVar9 = (int)uVar3 * uVar9;
          uVar7 = uVar9 / uVar11;
          uVar10 = uVar7 + uVar8;
          if (!CARRY4(uVar7,uVar8)) {
            if (remainder == (uint *)0x0) {
              return uVar10;
            }
            *remainder = uVar9 % uVar11;
            return uVar10;
          }
        }
        else {
          r_u16n = (uint16_t  [2])(uVar9 >> 0x10 | uVar9 << 0x10);
          r2_u16n[1] = (uint16_t)uVar3;
          r2_u16n[0] = (uint16_t)(uVar3 >> 0x10);
          d_u16n[1] = (uint16_t)uVar11;
          d_u16n[0] = (uint16_t)(uVar11 >> 0x10);
          _Var4 = mul_u16n(p_u16n,r_u16n,r2_u16n,4,2,2);
          if (_Var4) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x6f2,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
          wVar5 = div_u16n(qr_u16n,rr_u16n,w_u16n,p_u16n,d_u16n,2,4,2);
          if (wVar5 != L'\0') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x6f7,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
          sVar6 = msb_u16n(qr_u16n,2);
          if (0x20 < sVar6) {
            __assert_fail("msb_u16n(qr_u16n, MP_DIGITS) <= sizeof(unsigned int) * CHAR_BIT",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x6fa,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
          uVar11 = CONCAT22(qr_u16n[0],qr_u16n[1]) + uVar8;
          if (!CARRY4(CONCAT22(qr_u16n[0],qr_u16n[1]),uVar8)) {
            if (remainder == (uint *)0x0) {
              return uVar11;
            }
            sVar6 = msb_u16n(rr_u16n,4);
            if (sVar6 < 0x21) {
              *remainder = CONCAT22(rr_u16n[2],rr_u16n[3]);
              if (CONCAT22(rr_u16n[2],rr_u16n[3]) < a->d) {
                return uVar11;
              }
              __assert_fail("*remainder < a->d",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                            ,0x702,
                            "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                           );
            }
            __assert_fail("msb_u16n(rr_u16n, 2 * MP_DIGITS) <= sizeof(unsigned int) * CHAR_BIT",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x700,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
        }
      }
    }
    uVar11 = 0xffffffff;
  }
  if (remainder != (uint *)0x0) {
    *remainder = 0;
  }
  return uVar11;
}

Assistant:

unsigned int my_rational_to_uint(const struct my_rational *a,
		unsigned int scale, unsigned int *remainder)
{
	unsigned int result, r, q, r2, t;

	if (!scale) {
		if (remainder) {
			*remainder = 0;
		}
		return 0;
	}
	result = a->n / a->d;
	if (result > UINT_MAX / scale) {
		if (remainder) {
			*remainder = 0;
		}
		return UINT_MAX;
	}
	result *= scale;
	r = a->n % a->d;
	q = scale / a->d;
	if (result > UINT_MAX - q * r) {
		if (remainder) {
			*remainder = 0;
		}
		return UINT_MAX;
	}
	result += q * r;
	r2 = scale - q * a->d;
	if (r && r2 > UINT_MAX / r) {
		/*
		 * The product of the remainders overflows in the native
		 * arithmetic so use multiprecision integers.
		 */
#define MP_DIGITS ((sizeof(unsigned int) + (sizeof(uint16_t) - 1)) / sizeof(uint16_t))
		uint16_t r_u16n[MP_DIGITS], r2_u16n[MP_DIGITS];
		uint16_t d_u16n[MP_DIGITS], p_u16n[2 * MP_DIGITS];
		uint16_t qr_u16n[MP_DIGITS], rr_u16n[2 * MP_DIGITS];
		uint16_t w_u16n[MP_DIGITS + 1];
		bool over;

		over = ini_u16n(r_u16n, MP_DIGITS, r);
		if (over) {
			assert(0);
		}
		over = ini_u16n(r2_u16n, MP_DIGITS, r2);
		if (over) {
			assert(0);
		}
		over = ini_u16n(d_u16n, MP_DIGITS, a->d);
		if (over) {
			assert(0);
		}
		over = mul_u16n(p_u16n, r_u16n, r2_u16n, 2 * MP_DIGITS,
			MP_DIGITS, MP_DIGITS);
		if (over) {
			assert(0);
		}
		over = (div_u16n(qr_u16n, rr_u16n, w_u16n, p_u16n, d_u16n,
			MP_DIGITS, 2 * MP_DIGITS, MP_DIGITS) != 0);
		if (over) {
			assert(0);
		}
		assert(msb_u16n(qr_u16n, MP_DIGITS)
			<= sizeof(unsigned int) * CHAR_BIT);
		q = ext_u16n(qr_u16n, MP_DIGITS);
		if (result <= UINT_MAX - q) {
			result += q;
			if (remainder) {
				assert(msb_u16n(rr_u16n, 2 * MP_DIGITS)
					<= sizeof(unsigned int) * CHAR_BIT);
				*remainder = ext_u16n(rr_u16n, 2 * MP_DIGITS);
				assert(*remainder < a->d);
			}
		} else {
			result = UINT_MAX;
			if (remainder) {
				*remainder = 0;
			}
		}
		return result;
#undef MP_DIGITS
	}
	t = r * r2;
	q = t / a->d;
	if (result > UINT_MAX - q) {
		if (remainder) {
			*remainder = 0;
		}
		return UINT_MAX;
	}
	result += q;
	if (remainder) {
		*remainder = t - q * a->d;
	}
	return result;
}